

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.h
# Opt level: O3

void idx2::CopyGridGrid<double,double>(grid *SGrid,volume *SVol,grid *DGrid,volume *DVol)

{
  u64 uVar1;
  u64 uVar2;
  u64 uVar3;
  u64 uVar4;
  u64 uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  byte *pbVar9;
  long lVar10;
  byte *pbVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  byte *pbVar21;
  long lVar22;
  byte *pbVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  byte *local_88;
  byte *local_70;
  
  uVar1 = (SGrid->super_extent).Dims;
  uVar2 = SGrid->Strd;
  lVar8 = (long)(uVar2 * 2) >> 0x2b;
  iVar13 = (int)((long)(uVar1 * 2) >> 0x2b) * (int)((long)(uVar2 * 2) >> 0x2b);
  if (0 < iVar13) {
    uVar3 = (SGrid->super_extent).From;
    lVar25 = (long)(uVar3 << 0x2b) >> 0x2b;
    uVar4 = (DGrid->super_extent).From;
    lVar24 = (long)(SVol->Dims << 0x2b) >> 0x2b;
    lVar22 = (long)(uVar3 * 2) >> 0x2b;
    lVar10 = (long)(SVol->Dims << 0x16) >> 0x2b;
    lVar14 = (long)(uVar3 << 0x16) >> 0x2b;
    local_70 = (SVol->Buffer).Data + (lVar14 * 8 + lVar10 * lVar22 * 8) * lVar24 + lVar25 * 8;
    lVar20 = (long)(DVol->Dims << 0x16) >> 0x2b;
    lVar12 = (long)(uVar2 << 0x2b) >> 0x2b;
    uVar5 = DGrid->Strd;
    lVar16 = (long)(DVol->Dims << 0x2b) >> 0x2b;
    local_88 = (DVol->Buffer).Data +
               (((long)(uVar4 << 0x16) >> 0x2b) * 8 + ((long)(uVar4 * 2) >> 0x2b) * lVar20 * 8) *
               lVar16 + ((long)(uVar4 << 0x2b) >> 0x2b) * 8;
    iVar7 = (int)((long)(uVar3 << 0x16) >> 0x2b);
    iVar19 = (int)((long)(uVar1 << 0x16) >> 0x2b) * (int)((long)(uVar2 << 0x16) >> 0x2b) + iVar7;
    iVar6 = (int)((long)(uVar3 << 0x2b) >> 0x2b);
    iVar17 = (int)((long)(uVar1 << 0x2b) >> 0x2b) * (int)((long)(uVar2 << 0x2b) >> 0x2b) + iVar6;
    lVar15 = (long)(uVar2 << 0x16) >> 0x2b;
    do {
      pbVar21 = local_88;
      pbVar23 = local_70;
      lVar26 = lVar14;
      if (iVar7 < iVar19) {
        do {
          pbVar9 = pbVar21;
          pbVar11 = pbVar23;
          lVar18 = lVar25;
          if (iVar6 < iVar17) {
            do {
              *(undefined8 *)pbVar9 = *(undefined8 *)pbVar11;
              lVar18 = lVar18 + lVar12;
              pbVar9 = pbVar9 + ((long)(uVar5 << 0x2b) >> 0x2b) * 8;
              pbVar11 = pbVar11 + lVar12 * 8;
            } while (lVar18 < iVar17);
          }
          lVar26 = lVar26 + lVar15;
          pbVar21 = pbVar21 + ((long)(uVar5 << 0x16) >> 0x2b) * lVar16 * 8;
          pbVar23 = pbVar23 + lVar24 * lVar15 * 8;
        } while (lVar26 < iVar19);
      }
      lVar22 = lVar22 + lVar8;
      local_70 = local_70 + lVar10 * lVar8 * lVar24 * 8;
      local_88 = local_88 + lVar20 * ((long)(uVar5 * 2) >> 0x2b) * lVar16 * 8;
    } while (lVar22 < iVar13 + (int)((long)(uVar3 * 2) >> 0x2b));
  }
  return;
}

Assistant:

idx2_Inline v3i
Dims(const grid& Grid)
{
  return Unpack3i64(Grid.Dims);
}